

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O2

SATTIME __thiscall SATTIME::operator-(SATTIME *this,SATTIME *a)

{
  bool bVar1;
  double dVar2;
  SATTIME SVar3;
  
  dVar2 = this->SOW - a->SOW;
  bVar1 = dVar2 < 0.0;
  if (dVar2 < 0.0) {
    dVar2 = dVar2 + 604800.0;
  }
  SVar3.Week = (this->Week - a->Week) - (uint)bVar1;
  SVar3._4_4_ = 0;
  SVar3.SOW = dVar2;
  return SVar3;
}

Assistant:

SATTIME SATTIME::operator-(const SATTIME &a) const
{      
    SATTIME r;
    r.Week = this->Week - a.Week;
    r.SOW = this->SOW - a.SOW;
    if(r.SOW < 0)
    {
        r.SOW += 604800;
        r.Week -= 1;
    }
    return r;
}